

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O0

void __thiscall QMenuBarPrivate::_q_internalShortcutActivated(QMenuBarPrivate *this,int id)

{
  int iVar1;
  QMenuBar *pQVar2;
  const_reference ppQVar3;
  QMenu *pQVar4;
  QWidget *this_00;
  QWindow *pQVar5;
  const_reference pQVar6;
  QStyle *pQVar7;
  QMenuBarPrivate *in_RDI;
  QMenuBarPrivate *unaff_retaddr;
  QPlatformMenu *platformMenu;
  QAction *act;
  QMenuBar *q;
  QAction *in_stack_00000068;
  QWidget *in_stack_ffffffffffffffb8;
  QList<QAction_*> *in_stack_ffffffffffffffc0;
  ActionEvent action_e;
  QObject *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd8;
  undefined1 b;
  QMenuBarPrivate *pQVar8;
  undefined2 uVar9;
  
  b = (undefined1)((ulong)in_stack_ffffffffffffffd8 >> 0x38);
  pQVar8 = in_RDI;
  pQVar2 = q_func(in_RDI);
  uVar9 = (undefined2)((ulong)pQVar8 >> 0x30);
  ppQVar3 = QList<QAction_*>::at(in_stack_ffffffffffffffc0,(qsizetype)in_stack_ffffffffffffffb8);
  pQVar8 = (QMenuBarPrivate *)*ppQVar3;
  if ((pQVar8 != (QMenuBarPrivate *)0x0) &&
     (pQVar4 = QAction::menu<QMenu*>((QAction *)0x65ea75), pQVar4 != (QMenu *)0x0)) {
    QAction::menu<QMenu*>((QAction *)0x65ea85);
    this_00 = (QWidget *)QMenu::platformMenu((QMenu *)0x65ea8d);
    if (this_00 != (QWidget *)0x0) {
      pQVar5 = QWidget::windowHandle(this_00);
      pQVar6 = QList<QRect>::at((QList<QRect> *)this_00,(qsizetype)in_stack_ffffffffffffffb8);
      (**(code **)(*(long *)this_00 + 0xd0))(this_00,pQVar5,pQVar6,0);
      return;
    }
    b = 0;
  }
  QApplication::focusWidget();
  QPointer<QWidget>::operator=
            ((QPointer<QWidget> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  action_e = (ActionEvent)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  setCurrentAction(unaff_retaddr,in_stack_00000068,SUB21((ushort)uVar9 >> 8,0),SUB21(uVar9,0));
  if ((pQVar8 == (QMenuBarPrivate *)0x0) ||
     (pQVar4 = QAction::menu<QMenu*>((QAction *)0x65eb29), pQVar4 != (QMenu *)0x0)) {
    if (pQVar8 != (QMenuBarPrivate *)0x0) {
      pQVar7 = QWidget::style(in_stack_ffffffffffffffb8);
      iVar1 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x12,0,pQVar2);
      if (iVar1 != 0) {
        setKeyboardMode(pQVar8,(bool)b);
      }
    }
  }
  else {
    activateAction(in_RDI,(QAction *)in_stack_ffffffffffffffc8,action_e);
    QBasicTimer::start((QBasicTimer *)in_RDI,(int)((ulong)pQVar2 >> 0x20),in_stack_ffffffffffffffc8)
    ;
  }
  return;
}

Assistant:

void QMenuBarPrivate::_q_internalShortcutActivated(int id)
{
    Q_Q(QMenuBar);
    QAction *act = actions.at(id);
    if (act && act->menu()) {
        if (QPlatformMenu *platformMenu = act->menu()->platformMenu()) {
            platformMenu->showPopup(q->windowHandle(), actionRects.at(id), nullptr);
            return;
        }
    }

    keyboardFocusWidget = QApplication::focusWidget();
    setCurrentAction(act, true, true);
    if (act && !act->menu()) {
        activateAction(act, QAction::Trigger);
        //100 is the same as the default value in QPushButton::animateClick
        autoReleaseTimer.start(100, q);
    } else if (act && q->style()->styleHint(QStyle::SH_MenuBar_AltKeyNavigation, nullptr, q)) {
        // When we open a menu using a shortcut, we should end up in keyboard state
        setKeyboardMode(true);
    }
}